

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar1;
  char *this;
  undefined8 uVar2;
  Result RVar3;
  char *pcVar4;
  int iVar5;
  string_view filename;
  JSONParser parser_1;
  Script script;
  OptionParser parser;
  _Any_data local_268;
  code *local_258;
  code *pcStack_250;
  char *local_248;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined8 uStack_228;
  undefined4 uStack_220;
  undefined4 local_21c;
  undefined4 uStack_218;
  undefined8 uStack_214;
  undefined1 local_208;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
  local_1d8;
  undefined1 local_1c0 [88];
  vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> local_168;
  _Any_data local_150;
  _Manager_type local_140;
  uint local_48;
  uint local_44;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  uVar2 = local_1c0._0_8_;
  uVar1 = s_stdout_stream;
  local_1c0._0_8_ = (long *)0x0;
  s_stdout_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)uVar2;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar1._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar1._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
    if ((long *)local_1c0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c0._0_8_ + 8))();
    }
  }
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_1c0,"spectest-interp",
             "  read a Spectest JSON file, and run its tests in the interpreter.\n\nexamples:\n  # parse test.json and run the spec tests\n  $ spectest-interp test.json\n"
            );
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  pcStack_250 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:70:72)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:70:72)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1c0,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_1c0);
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  pcStack_250 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:77:20)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:77:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1c0,'V',"value-stack-size","SIZE",
             "Size in elements of the value stack",(Callback *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  pcStack_250 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:83:20)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:83:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1c0,'C',"call-stack-size","SIZE",
             "Size in elements of the call stack",(Callback *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  pcStack_250 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:88:20)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:88:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1c0,'t',"trace","Trace execution",(NullCallback *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  local_258 = (code *)0x656d616e656c6966;
  local_268._8_8_ = 8;
  pcStack_250 = (code *)((ulong)pcStack_250 & 0xffffffffffffff00);
  local_1f8._M_unused._M_object = (code **)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:91:22)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:91:22)>
              ::_M_manager;
  local_268._M_unused._M_object = &local_258;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_1c0,(string *)&local_268,One,(Callback *)&local_1f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,3);
  }
  if ((code **)local_268._M_unused._0_8_ != &local_258) {
    operator_delete(local_268._M_unused._M_object);
  }
  wabt::OptionParser::Parse((OptionParser *)local_1c0,argc,argv);
  if (local_140 != (_Manager_type)0x0) {
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_168);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             (local_1c0 + 0x40));
  if ((undefined1 *)local_1c0._32_8_ != local_1c0 + 0x30) {
    operator_delete((void *)local_1c0._32_8_);
  }
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_);
  }
  this = s_infile;
  pcVar4 = (char *)strlen(s_infile);
  uStack_218 = 0;
  uStack_214 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  local_21c = 0;
  local_208 = 0;
  uStack_230 = 0;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_258 = (code *)0x0;
  pcStack_250 = (code *)0x0;
  local_248 = this;
  uStack_240 = SUB84(pcVar4,0);
  uStack_23c = (undefined4)((ulong)pcVar4 >> 0x20);
  local_238 = 1;
  uStack_234 = 1;
  filename.size_ = (size_type)&local_268;
  filename.data_ = pcVar4;
  RVar3 = wabt::ReadFile((wabt *)this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x100000001);
  iVar5 = 1;
  if (RVar3.enum_ != Error) {
    local_1f8._8_8_ = 0;
    local_1e8 = (code *)((ulong)local_1e8 & 0xffffffffffffff00);
    local_1d8.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8._M_unused._M_object = &local_1e8;
    RVar3 = spectest::JSONParser::ParseScript((JSONParser *)&local_268,(Script *)&local_1f8);
    iVar5 = 1;
    if (RVar3.enum_ != Error) {
      spectest::CommandRunner::CommandRunner((CommandRunner *)local_1c0);
      RVar3 = spectest::CommandRunner::Run((CommandRunner *)local_1c0,(Script *)&local_1f8);
      iVar5 = 1;
      if (RVar3.enum_ != Error) {
        printf("%d/%d tests passed.\n",(ulong)local_48,(ulong)local_44);
        iVar5 = local_44 - local_48;
      }
      spectest::CommandRunner::~CommandRunner((CommandRunner *)local_1c0);
    }
    std::
    vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ::~vector(&local_1d8);
    if ((code **)local_1f8._M_unused._0_8_ != &local_1e8) {
      operator_delete(local_1f8._M_unused._M_object);
    }
  }
  if (local_268._M_unused._M_object != (void *)0x0) {
    operator_delete(local_268._M_unused._M_object);
  }
  return iVar5;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();

  ParseOptions(argc, argv);
  return spectest::ReadAndRunSpecJSON(s_infile);
}